

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

float __thiscall OpenMD::StringTokenizer::nextTokenAsFloat(StringTokenizer *this)

{
  StringTokenizer *this_00;
  double dVar1;
  string token;
  _Alloc_hider local_28;
  
  this_00 = (StringTokenizer *)&stack0xffffffffffffffd8;
  nextToken_abi_cxx11_((string *)&stack0xffffffffffffffd8,this);
  convertFortranNumber(this_00,(string *)&stack0xffffffffffffffd8);
  dVar1 = atof(local_28._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return (float)dVar1;
}

Assistant:

float StringTokenizer::nextTokenAsFloat() {
    std::string token = nextToken();
    convertFortranNumber(token);
    return (float)(atof(token.c_str()));
  }